

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_jump_stmt(gvisitor_t *self,gnode_jump_stmt_t *node)

{
  gtoken_t gVar1;
  long lVar2;
  long *plVar3;
  int *piVar4;
  _Bool _Var5;
  uint uVar6;
  char *format;
  
  gVar1 = (node->base).token.type;
  if (gVar1 != TOK_KEY_RETURN) {
    if (gVar1 == TOK_KEY_CONTINUE) {
      lVar2 = *(long *)((long)self->data + 8);
      if ((lVar2 != 0) &&
         ((ushort)(*(short *)(*(long *)((long)self->data + 0x18) + -2 + lVar2 * 2) - 0x13U) < 3)) {
        return;
      }
      format = "\'continue\' statement not in loop statement.";
    }
    else {
      if (gVar1 != TOK_KEY_BREAK) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                      ,0x2d9,"void visit_jump_stmt(gvisitor_t *, gnode_jump_stmt_t *)");
      }
      lVar2 = *(long *)((long)self->data + 8);
      if (((lVar2 != 0) &&
          (uVar6 = (uint)*(ushort *)(*(long *)((long)self->data + 0x18) + -2 + lVar2 * 2),
          uVar6 < 0x16)) && ((0x388000U >> (uVar6 & 0x1f) & 1) != 0)) {
        return;
      }
      format = "\'break\' statement not in loop or switch statement.";
    }
LAB_0011c6d5:
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,format);
    return;
  }
  plVar3 = *self->data;
  if (((plVar3 == (long *)0x0) || (*plVar3 == 0)) ||
     ((piVar4 = *(int **)(plVar3[2] + -8 + *plVar3 * 8), piVar4 == (int *)0x0 || (*piVar4 != 8)))) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "\'return\' statement not in a function definition.");
  }
  if (node->expr != (gnode_t *)0x0) {
    gvisit(self,node->expr);
    node = (gnode_jump_stmt_t *)node->expr;
    _Var5 = is_expression_valid((gnode_t *)node);
    if (!_Var5) {
      format = "Invalid expression.";
      goto LAB_0011c6d5;
    }
  }
  return;
}

Assistant:

static void visit_jump_stmt (gvisitor_t *self, gnode_jump_stmt_t *node) {
    DEBUG_CODEGEN("visit_jump_stmt");
    DECLARE_CODE();

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_BREAK) || (type == TOK_KEY_CONTINUE) || (type == TOK_KEY_RETURN));

    if (type == TOK_KEY_BREAK) {
        uint32_t label = ircode_getlabel_false(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $end;
    } else if (type == TOK_KEY_CONTINUE) {
        uint32_t label = ircode_getlabel_check(code);
		ircode_add(code, JUMP, label, 0, 0, LINE_NUMBER(node)); // goto $start;
    } else if (type == TOK_KEY_RETURN) {
        if (node->expr) {
            visit(node->expr);
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid return expression.");
			ircode_add(code, RET, reg, 0, 0, LINE_NUMBER(node));
        } else {
			ircode_add(code, RET0, 0, 0, 0, LINE_NUMBER(node));
        }
    }
}